

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptor::DebugString
          (MethodDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  ushort *puVar1;
  FeatureSet *from;
  bool bVar2;
  Descriptor *pDVar3;
  FeatureSet *this_00;
  char *pcVar4;
  char *p;
  string_view format;
  string_view format_00;
  Arg *a5;
  string prefix;
  string formatted_options;
  MethodOptions full_options;
  Arg local_188;
  Arg local_158;
  SourceLocationCommentPrinter comment_printer;
  Arg local_90;
  Arg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  full_options.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)prefix._M_string_length;
  full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)prefix._M_dataplus._M_p;
  puVar1 = (ushort *)(this->all_names_).payload_;
  local_158.piece_._M_len = (size_t)*puVar1;
  local_158.piece_._M_str = (char *)((long)puVar1 + ~local_158.piece_._M_len);
  pDVar3 = input_type(this);
  local_188.piece_._M_str = (pDVar3->all_names_).payload_;
  local_188.piece_._M_len = (size_t)*(ushort *)(local_188.piece_._M_str + 2);
  local_188.piece_._M_str = local_188.piece_._M_str + ~local_188.piece_._M_len;
  pDVar3 = output_type(this);
  pcVar4 = (pDVar3->all_names_).payload_;
  formatted_options._M_dataplus._M_p = (pointer)(ulong)*(ushort *)(pcVar4 + 2);
  formatted_options._M_string_length =
       (size_type)(pcVar4 + ~(ulong)formatted_options._M_dataplus._M_p);
  p = "";
  pcVar4 = "";
  if (this->client_streaming_ != false) {
    pcVar4 = "stream ";
  }
  local_60.piece_ = absl::lts_20250127::NullSafeStringView(pcVar4);
  if (this->server_streaming_ != false) {
    p = "stream ";
  }
  a5 = (Arg *)0x189131;
  local_90.piece_ = absl::lts_20250127::NullSafeStringView(p);
  format._M_str = (char *)&full_options;
  format._M_len = (size_t)"$0rpc $1($4.$2) returns ($5.$3)";
  absl::lts_20250127::SubstituteAndAppend
            ((lts_20250127 *)contents,(Nonnull<std::string_*>)0x1f,format,&local_158,&local_188,
             (Arg *)&formatted_options,&local_60,&local_90,a5);
  MethodOptions::MethodOptions(&full_options,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    this_00 = MethodOptions::mutable_features(&full_options);
    FeatureSet::CopyFrom(this_00,from);
  }
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  bVar2 = anon_unknown_24::FormatLineOptions
                    (depth + 1,&full_options.super_Message,this->service_->file_->pool_,
                     &formatted_options);
  if (bVar2) {
    local_158.piece_._M_len = formatted_options._M_string_length;
    local_158.piece_._M_str = formatted_options._M_dataplus._M_p;
    local_188.piece_._M_len = prefix._M_string_length;
    local_188.piece_._M_str = prefix._M_dataplus._M_p;
    format_00._M_str = " {\n$0$1}\n";
    format_00._M_len = 9;
    absl::lts_20250127::SubstituteAndAppend(contents,format_00,&local_158,&local_188);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  std::__cxx11::string::~string((string *)&formatted_options);
  MethodOptions::~MethodOptions(&full_options);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void MethodDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(
      contents, "$0rpc $1($4.$2) returns ($5.$3)", prefix, name(),
      input_type()->full_name(), output_type()->full_name(),
      client_streaming() ? "stream " : "", server_streaming() ? "stream " : "");

  MethodOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  std::string formatted_options;
  if (FormatLineOptions(depth, full_options, service()->file()->pool(),
                        &formatted_options)) {
    absl::SubstituteAndAppend(contents, " {\n$0$1}\n", formatted_options,
                              prefix);
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}